

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_many_options_custom(void)

{
  int iVar1;
  uint uVar2;
  char *local_2e8;
  char *args [2];
  char optname [256];
  int vals [100];
  undefined1 local_40 [8];
  _test_rect_t rect;
  size_t j;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&j,0,"program");
  if (iVar1 == 0) {
    local_2e8 = "program";
    args[0] = "--help";
    rect.w = 0;
    rect.h = 0;
    for (; (ulong)rect._8_8_ < 0x65; rect._8_8_ = rect._8_8_ + 1) {
      if (rect._8_8_ == 0x32) {
        uVar2 = cargo_add_option((cargo_t)j,0,"--alpha","The alpha","[c]#",
                                 _test_cb_fixed_array_no_count,local_40,0,4);
        cargo._4_4_ = uVar2 | cargo._4_4_;
        if (cargo._4_4_ != 0) {
          pcStack_18 = "Failed to add options";
          goto LAB_00120194;
        }
      }
      else {
        cargo_snprintf((char *)(args + 1),0x100,"--opto%02d",rect._8_8_ + 1);
        uVar2 = cargo_add_option((cargo_t)j,0,(char *)(args + 1),
                                 "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut aliquip ex ea commodo consequat. Duis aute irure dolor in reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla pariatur. Excepteur sint occaecat cupidatat non proident, sunt in culpa qui officia deserunt mollit anim id est laborum."
                                 ,"i",vals + rect._8_8_ + -2);
        cargo._4_4_ = uVar2 | cargo._4_4_;
        if (cargo._4_4_ != 0) {
          pcStack_18 = "Failed to add option";
          goto LAB_00120194;
        }
      }
      cargo._4_4_ = 0;
    }
    cargo._4_4_ = cargo_parse((cargo_t)j,0,1,2,&local_2e8);
    cargo_print_usage((cargo_t)j,CARGO_USAGE_FULL);
LAB_00120194:
    cargo_destroy((cargo_t *)&j);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_many_options_custom)
{
    size_t j = 0;
    _test_rect_t rect;
    #define OPT_COUNT 100
    int vals[OPT_COUNT];
    char optname[256];
    char *args[] = { "program", "--help" };

    // This reproduces a bug seen on the raspberry pi where
    // you get a SIGSEV because the internal list for a custom
    // variable would be freed and then target count was dereferenced
    // (which now was freed).
    for (j = 0; j < OPT_COUNT + 1; j++)
    {
        if (j == (OPT_COUNT / 2))
        {
            ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "[c]#",
                            _test_cb_fixed_array_no_count,
                            &rect, NULL, 4);
            cargo_assert(ret == 0, "Failed to add options");
            continue;
        }
        cargo_snprintf(optname, sizeof(optname), "--opto%02d",  j+1);
        ret |= cargo_add_option(cargo, 0, optname, LOREM_IPSUM, "i", &vals[j]);
        cargo_assert(ret == 0, "Failed to add option");
    }

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);

    cargo_print_usage(cargo, 0);

    _TEST_CLEANUP();
}